

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::SetItemAccessors
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr,DynamicObject *instance,uint32 index,
          Var getter,Var setter)

{
  bool bVar1;
  byte bVar2;
  uint32 uVar3;
  IndexPropertyDescriptorMap *pIVar4;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  undefined1 local_78 [20];
  uint32 newLength;
  Type local_50;
  IndexPropertyDescriptor *descriptor;
  JavascriptLibrary *lib;
  Var setter_local;
  Var getter_local;
  Type TStack_28;
  uint32 index_local;
  DynamicObject *instance_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  lib = (JavascriptLibrary *)setter;
  setter_local = getter;
  getter_local._4_4_ = index;
  TStack_28.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)arr;
  arr_local = (ES5Array *)this;
  bVar1 = CanSetItemAt(this,arr,index);
  if (bVar1) {
    descriptor = (IndexPropertyDescriptor *)
                 RecyclableObject::GetLibrary((RecyclableObject *)TStack_28.ptr);
    if (setter_local != (Var)0x0) {
      setter_local = DynamicTypeHandler::CanonicalizeAccessor
                               (setter_local,(JavascriptLibrary *)descriptor);
    }
    if (lib != (JavascriptLibrary *)0x0) {
      lib = (JavascriptLibrary *)
            DynamicTypeHandler::CanonicalizeAccessor(lib,(JavascriptLibrary *)descriptor);
    }
    Js::JavascriptArray::DirectDeleteItemAt<void*>
              ((JavascriptArray *)instance_local,getter_local._4_4_);
    pIVar4 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                       (&this->indexPropertyMap);
    bVar1 = IndexPropertyDescriptorMap::TryGetReference
                      (pIVar4,getter_local._4_4_,(IndexPropertyDescriptor **)&local_50);
    if (bVar1) {
      if (((ulong)((local_50.ptr)->super_JavascriptFunction).super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject & 8) != 0) {
        *(undefined1 *)
         &((local_50.ptr)->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 7;
      }
      if (setter_local != (Var)0x0) {
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   &((local_50.ptr)->super_JavascriptFunction).super_DynamicObject.
                    super_RecyclableObject.type,setter_local);
      }
      if (lib != (JavascriptLibrary *)0x0) {
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   &((local_50.ptr)->super_JavascriptFunction).super_DynamicObject.auxSlots,lib);
      }
    }
    else {
      pIVar4 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      uVar3 = getter_local._4_4_;
      IndexPropertyDescriptor::IndexPropertyDescriptor
                ((IndexPropertyDescriptor *)(local_78 + 0x10),setter_local,lib);
      IndexPropertyDescriptorMap::Add(pIVar4,uVar3,(IndexPropertyDescriptor *)(local_78 + 0x10));
    }
    uVar3 = ArrayObject::GetLength((ArrayObject *)instance_local);
    if (uVar3 <= getter_local._4_4_) {
      local_78._12_4_ = getter_local._4_4_;
      UInt32Math::Inc((uint32 *)(local_78 + 0xc));
      Js::JavascriptArray::SetLength((JavascriptArray *)instance_local,local_78._12_4_);
    }
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
    bVar2 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
    if ((bVar2 & 0x20) != 0) {
      RecyclableObject::GetLibrary((RecyclableObject *)TStack_28.ptr);
      JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                ((JavascriptLibrary *)local_78);
      this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                            *)local_78);
      PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var getter, Var setter)
    {
        // Reject if we need to grow non-writable length
        if (!CanSetItemAt(arr, index))
        {
            return false;
        }

        JavascriptLibrary* lib = instance->GetLibrary();
        if (getter)
        {
            getter = this->CanonicalizeAccessor(getter, lib);
        }
        if (setter)
        {
            setter = this->CanonicalizeAccessor(setter, lib);
        }

        // conversion from data-property to accessor property
        arr->DirectDeleteItemAt<Var>(index);

        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                descriptor->Attributes = PropertyDynamicTypeDefaults;
            }
            if (getter)
            {
                descriptor->Getter = getter;
            }
            if (setter)
            {
                descriptor->Setter = setter;
            }
        }
        else
        {
            indexPropertyMap->Add(index, IndexPropertyDescriptor(getter, setter));
        }

        if (arr->GetLength() <= index)
        {
            uint32 newLength = index;
            UInt32Math::Inc(newLength);
            arr->SetLength(newLength);
        }

        this->ClearHasOnlyWritableDataProperties();
        if(this->GetFlags() & this->IsPrototypeFlag)
        {
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
        return true;
    }